

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<unsigned_int>::reserve(Array<unsigned_int> *this,usize size)

{
  uint *puVar1;
  uint *puVar2;
  uint *end;
  uint *src;
  uint *dest;
  uint *newData;
  usize size_local;
  Array<unsigned_int> *this_local;
  
  if ((this->_capacity < size) || (((this->_begin).item == (uint *)0x0 && (size != 0)))) {
    if (this->_capacity < size) {
      this->_capacity = size;
    }
    this->_capacity = this->_capacity | 3;
    puVar2 = (uint *)operator_new__(this->_capacity << 2);
    src = puVar2;
    if ((this->_begin).item != (uint *)0x0) {
      puVar1 = (this->_end).item;
      for (end = (this->_begin).item; end != puVar1; end = end + 1) {
        *src = *end;
        src = src + 1;
      }
      puVar1 = (this->_begin).item;
      if (puVar1 != (uint *)0x0) {
        operator_delete__(puVar1);
      }
    }
    (this->_begin).item = puVar2;
    (this->_end).item = src;
  }
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }